

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

void __thiscall wasm::MultiMemoryLowering::makeOffsetGlobals(MultiMemoryLowering *this)

{
  Module *module;
  size_type sVar1;
  pointer pMVar2;
  mapped_type *pmVar3;
  address64_t aVar4;
  Name NVar5;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string_view local_50;
  undefined1 local_40 [8];
  Name name;
  value_type *memory;
  long lStack_20;
  Index i;
  size_t offsetRunningTotal;
  anon_class_8_1_8991fb9c addGlobal;
  MultiMemoryLowering *this_local;
  
  lStack_20 = 0;
  memory._4_4_ = 0;
  offsetRunningTotal = (size_t)this;
  addGlobal.this = this;
  while( true ) {
    sVar1 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::size(&this->wasm->memories);
    if (sVar1 <= memory._4_4_) break;
    name.super_IString.str._M_str =
         (char *)std::
                 vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ::operator[](&this->wasm->memories,(ulong)memory._4_4_);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                        name.super_IString.str._M_str);
    pmVar3 = std::
             unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
             ::operator[](&this->memoryIdxMap,(key_type *)pMVar2);
    *pmVar3 = memory._4_4_;
    if (memory._4_4_ != 0) {
      module = this->wasm;
      pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                          name.super_IString.str._M_str);
      IString::toString_abi_cxx11_(&local_90,(IString *)pMVar2);
      std::operator+(&local_70,&local_90,"_byte_offset");
      wasm::Name::Name((Name *)&local_50,&local_70);
      NVar5 = Names::getValidGlobalName(module,(Name)local_50);
      name.super_IString.str._M_len = NVar5.super_IString.str._M_str;
      local_40 = NVar5.super_IString.str._M_len;
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                (&this->offsetGlobalNames,(value_type *)local_40);
      NVar5.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
      NVar5.super_IString.str._M_len = (size_t)local_40;
      makeOffsetGlobals::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&offsetRunningTotal,NVar5,lStack_20 << 0x10);
    }
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                        name.super_IString.str._M_str);
    aVar4 = wasm::Address::operator_cast_to_unsigned_long(&pMVar2->initial);
    lStack_20 = aVar4 + lStack_20;
    memory._4_4_ = memory._4_4_ + 1;
  }
  return;
}

Assistant:

void makeOffsetGlobals() {
    auto addGlobal = [&](Name name, size_t offset) {
      auto global = Builder::makeGlobal(
        name,
        pointerType,
        Builder(*wasm).makeConst(Literal::makeFromInt64(offset, pointerType)),
        Builder::Mutable);
      wasm->addGlobal(std::move(global));
    };

    size_t offsetRunningTotal = 0;
    for (Index i = 0; i < wasm->memories.size(); i++) {
      auto& memory = wasm->memories[i];
      memoryIdxMap[memory->name] = i;
      // We don't need a page offset global for the first memory as it's always
      // 0
      if (i != 0) {
        Name name = Names::getValidGlobalName(
          *wasm, memory->name.toString() + "_byte_offset");
        offsetGlobalNames.push_back(std::move(name));
        addGlobal(name, offsetRunningTotal * Memory::kPageSize);
      }
      offsetRunningTotal += memory->initial;
    }
  }